

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraint.cpp
# Opt level: O2

btScalar __thiscall
btMultiBodyConstraint::fillMultiBodyConstraint
          (btMultiBodyConstraint *this,btMultiBodySolverConstraint *solverConstraint,
          btMultiBodyJacobianData *data,btScalar *jacOrgA,btScalar *jacOrgB,
          btVector3 *contactNormalOnB,btVector3 *posAworld,btVector3 *posBworld,btScalar posError,
          btContactSolverInfo *infoGlobal,btScalar lowerLimit,btScalar upperLimit,
          btScalar relaxation,bool isFriction,btScalar desiredVelocity,btScalar cfmSlip)

{
  btScalar *pbVar1;
  btMultiBody *this_00;
  btMultiBody *this_01;
  float *pfVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  btRigidBody *this_02;
  btSolverBody *pbVar13;
  btVector3 *pbVar14;
  uint uVar15;
  btSolverBody *pbVar16;
  bool bVar17;
  undefined1 auVar18 [12];
  undefined1 in_register_00001244 [12];
  undefined8 uVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  btScalar bVar27;
  btScalar bVar28;
  float fVar29;
  btVector3 bVar30;
  btVector3 bVar31;
  btVector3 torqueAxis0;
  btRigidBody *local_c0;
  btVector3 local_88;
  btVector3 local_78;
  undefined1 local_68 [16];
  btScalar local_58;
  btVector3 local_40;
  
  uVar24 = in_register_00001244._4_8_;
  local_68._8_8_ = local_68._0_8_;
  local_68._0_8_ = jacOrgB;
  this_00 = this->m_bodyA;
  solverConstraint->m_multiBodyA = this_00;
  this_01 = this->m_bodyB;
  solverConstraint->m_multiBodyB = this_01;
  solverConstraint->m_linkA = this->m_linkA;
  solverConstraint->m_linkB = this->m_linkB;
  if (this_00 == (btMultiBody *)0x0) {
    pbVar13 = data->m_solverBodyPool->m_data + solverConstraint->m_solverBodyIdA;
  }
  else {
    pbVar13 = (btSolverBody *)0x0;
  }
  if (this_01 == (btMultiBody *)0x0) {
    pbVar16 = data->m_solverBodyPool->m_data + solverConstraint->m_solverBodyIdB;
  }
  else {
    pbVar16 = (btSolverBody *)0x0;
  }
  if (this_00 == (btMultiBody *)0x0) {
    this_02 = pbVar13->m_originalBody;
  }
  else {
    this_02 = (btRigidBody *)0x0;
  }
  if (this_01 == (btMultiBody *)0x0) {
    local_c0 = pbVar16->m_originalBody;
  }
  else {
    local_c0 = (btRigidBody *)0x0;
  }
  local_58 = relaxation;
  if (pbVar13 != (btSolverBody *)0x0) {
    local_78 = operator-(posAworld,&(pbVar13->m_worldTransform).m_origin);
  }
  if (pbVar16 != (btSolverBody *)0x0) {
    local_88 = operator-(posBworld,&(pbVar16->m_worldTransform).m_origin);
  }
  if (this_00 == (btMultiBody *)0x0) {
    torqueAxis0 = btVector3::cross(&local_78,contactNormalOnB);
    if (this_02 == (btRigidBody *)0x0) {
      bVar30.m_floats = (btScalar  [4])ZEXT816(0);
      uVar24 = 0;
    }
    else {
      local_40 = operator*((btMatrix3x3 *)&(this_02->super_btCollisionObject).field_0x14c,
                           &torqueAxis0);
      bVar30 = operator*(&local_40,&this_02->m_angularFactor);
    }
    *&(solverConstraint->m_angularComponentA).m_floats = bVar30.m_floats;
    *(undefined8 *)(solverConstraint->m_relpos1CrossNormal).m_floats = torqueAxis0.m_floats._0_8_;
    *(undefined8 *)((solverConstraint->m_relpos1CrossNormal).m_floats + 2) =
         torqueAxis0.m_floats._8_8_;
  }
  else {
    if ((long)solverConstraint->m_linkA < 0) {
      pbVar14 = &this_00->m_basePos;
    }
    else {
      pbVar14 = &(this_00->m_links).m_data[solverConstraint->m_linkA].m_cachedWorldTransform.
                 m_origin;
    }
    local_78 = operator-(posAworld,pbVar14);
    iVar11 = this_00->m_companionId;
    uVar15 = this_00->m_dofCount + 6;
    solverConstraint->m_deltaVelAindex = iVar11;
    if (iVar11 < 0) {
      iVar11 = (data->m_deltaVelocities).m_size;
      solverConstraint->m_deltaVelAindex = iVar11;
      this_00->m_companionId = iVar11;
      auVar4._12_4_ = 0;
      auVar4._0_4_ = torqueAxis0.m_floats[1];
      auVar4._4_4_ = torqueAxis0.m_floats[2];
      auVar4._8_4_ = torqueAxis0.m_floats[3];
      torqueAxis0.m_floats = (btScalar  [4])(auVar4 << 0x20);
      btAlignedObjectArray<float>::resize
                (&data->m_deltaVelocities,iVar11 + uVar15,torqueAxis0.m_floats);
    }
    iVar11 = (data->m_jacobians).m_size;
    solverConstraint->m_jacAindex = iVar11;
    auVar5._12_4_ = 0;
    auVar5._0_4_ = torqueAxis0.m_floats[1];
    auVar5._4_4_ = torqueAxis0.m_floats[2];
    auVar5._8_4_ = torqueAxis0.m_floats[3];
    torqueAxis0.m_floats = (btScalar  [4])(auVar5 << 0x20);
    btAlignedObjectArray<float>::resize(&data->m_jacobians,iVar11 + uVar15,torqueAxis0.m_floats);
    pbVar1 = (data->m_jacobians).m_data + solverConstraint->m_jacAindex;
    if (jacOrgA == (btScalar *)0x0) {
      btMultiBody::fillContactJacobianMultiDof
                (this_00,solverConstraint->m_linkA,posAworld,contactNormalOnB,pbVar1,
                 &data->scratch_r,&data->scratch_v,&data->scratch_m);
    }
    else {
      uVar10 = 0;
      uVar12 = 0;
      if (0 < (int)uVar15) {
        uVar12 = (ulong)uVar15;
      }
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        pbVar1[uVar10] = jacOrgA[uVar10];
      }
    }
    auVar6._12_4_ = 0;
    auVar6._0_4_ = torqueAxis0.m_floats[1];
    auVar6._4_4_ = torqueAxis0.m_floats[2];
    auVar6._8_4_ = torqueAxis0.m_floats[3];
    torqueAxis0.m_floats = (btScalar  [4])(auVar6 << 0x20);
    btAlignedObjectArray<float>::resize
              (&data->m_deltaVelocitiesUnitImpulse,
               uVar15 + (data->m_deltaVelocitiesUnitImpulse).m_size,torqueAxis0.m_floats);
    btMultiBody::calcAccelerationDeltasMultiDof
              (this_00,(data->m_jacobians).m_data + solverConstraint->m_jacAindex,
               (data->m_deltaVelocitiesUnitImpulse).m_data + solverConstraint->m_jacAindex,
               &data->scratch_r,&data->scratch_v);
    bVar30 = btVector3::cross(&local_78,contactNormalOnB);
    *&(solverConstraint->m_relpos1CrossNormal).m_floats = bVar30.m_floats;
  }
  uVar3 = *(undefined8 *)(contactNormalOnB->m_floats + 2);
  *(undefined8 *)(solverConstraint->m_contactNormal1).m_floats =
       *(undefined8 *)contactNormalOnB->m_floats;
  *(undefined8 *)((solverConstraint->m_contactNormal1).m_floats + 2) = uVar3;
  if (this_01 == (btMultiBody *)0x0) {
    bVar30 = btVector3::cross(&local_88,contactNormalOnB);
    auVar19._0_8_ = bVar30.m_floats._8_8_;
    auVar19._8_8_ = uVar24;
    uVar10 = (ulong)DAT_001af270;
    if (local_c0 == (btRigidBody *)0x0) {
      auVar18 = auVar19._0_12_ ^ DAT_001af270._0_12_;
      auVar21._0_8_ = auVar18._0_8_ & 0xffffffff;
      auVar21._8_4_ = auVar18._4_4_;
      auVar21._12_4_ = 0;
      bVar31.m_floats = (btScalar  [4])ZEXT816(0);
    }
    else {
      local_40.m_floats._0_8_ = bVar30.m_floats._0_8_ ^ uVar10;
      auVar19 = auVar19 ^ _DAT_001af270;
      local_68._0_8_ = auVar19._0_8_ & 0xffffffff;
      local_68._8_4_ = auVar19._4_4_;
      local_68._12_4_ = 0;
      local_40.m_floats[2] = (btScalar)auVar19._0_4_;
      local_40.m_floats[3] = 0.0;
      torqueAxis0 = operator*((btMatrix3x3 *)&(local_c0->super_btCollisionObject).field_0x14c,
                              &local_40);
      bVar31 = operator*(&torqueAxis0,&local_c0->m_angularFactor);
      auVar21 = local_68;
    }
    uVar10 = bVar30.m_floats._0_8_ ^ uVar10;
    *&(solverConstraint->m_angularComponentB).m_floats = bVar31.m_floats;
  }
  else {
    if ((long)solverConstraint->m_linkB < 0) {
      pbVar14 = &this_01->m_basePos;
    }
    else {
      pbVar14 = &(this_01->m_links).m_data[solverConstraint->m_linkB].m_cachedWorldTransform.
                 m_origin;
    }
    local_88 = operator-(posBworld,pbVar14);
    iVar11 = this_01->m_companionId;
    uVar15 = this_01->m_dofCount + 6;
    solverConstraint->m_deltaVelBindex = iVar11;
    if (iVar11 < 0) {
      iVar11 = (data->m_deltaVelocities).m_size;
      solverConstraint->m_deltaVelBindex = iVar11;
      this_01->m_companionId = iVar11;
      auVar7._12_4_ = 0;
      auVar7._0_4_ = torqueAxis0.m_floats[1];
      auVar7._4_4_ = torqueAxis0.m_floats[2];
      auVar7._8_4_ = torqueAxis0.m_floats[3];
      torqueAxis0.m_floats = (btScalar  [4])(auVar7 << 0x20);
      btAlignedObjectArray<float>::resize
                (&data->m_deltaVelocities,iVar11 + uVar15,torqueAxis0.m_floats);
    }
    iVar11 = (data->m_jacobians).m_size;
    solverConstraint->m_jacBindex = iVar11;
    auVar8._12_4_ = 0;
    auVar8._0_4_ = torqueAxis0.m_floats[1];
    auVar8._4_4_ = torqueAxis0.m_floats[2];
    auVar8._8_4_ = torqueAxis0.m_floats[3];
    torqueAxis0.m_floats = (btScalar  [4])(auVar8 << 0x20);
    btAlignedObjectArray<float>::resize(&data->m_jacobians,iVar11 + uVar15,torqueAxis0.m_floats);
    if (local_68._0_8_ == 0) {
      iVar11 = solverConstraint->m_linkB;
      torqueAxis0 = operator-(contactNormalOnB);
      btMultiBody::fillContactJacobianMultiDof
                (this_01,iVar11,posBworld,&torqueAxis0,
                 (data->m_jacobians).m_data + solverConstraint->m_jacBindex,&data->scratch_r,
                 &data->scratch_v,&data->scratch_m);
    }
    else {
      uVar10 = 0;
      uVar12 = 0;
      if (0 < (int)uVar15) {
        uVar12 = (ulong)uVar15;
      }
      iVar11 = solverConstraint->m_jacBindex;
      pfVar2 = (data->m_jacobians).m_data;
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        pfVar2[(long)iVar11 + uVar10] = *(float *)(local_68._0_8_ + uVar10 * 4);
      }
    }
    auVar9._12_4_ = 0;
    auVar9._0_4_ = torqueAxis0.m_floats[1];
    auVar9._4_4_ = torqueAxis0.m_floats[2];
    auVar9._8_4_ = torqueAxis0.m_floats[3];
    torqueAxis0.m_floats = (btScalar  [4])(auVar9 << 0x20);
    btAlignedObjectArray<float>::resize
              (&data->m_deltaVelocitiesUnitImpulse,
               uVar15 + (data->m_deltaVelocitiesUnitImpulse).m_size,torqueAxis0.m_floats);
    btMultiBody::calcAccelerationDeltasMultiDof
              (this_01,(data->m_jacobians).m_data + solverConstraint->m_jacBindex,
               (data->m_deltaVelocitiesUnitImpulse).m_data + solverConstraint->m_jacBindex,
               &data->scratch_r,&data->scratch_v);
    bVar30 = btVector3::cross(&local_88,contactNormalOnB);
    auVar20._0_8_ = bVar30.m_floats._8_8_;
    auVar20._8_8_ = uVar24;
    uVar10 = bVar30.m_floats._0_8_ ^ (ulong)DAT_001af270;
    auVar18 = auVar20._0_12_ ^ DAT_001af270._0_12_;
    auVar21._0_8_ = auVar18._0_8_ & 0xffffffff;
    auVar21._8_4_ = auVar18._4_4_;
    auVar21._12_4_ = 0;
  }
  uVar24 = auVar21._8_8_;
  *(ulong *)(solverConstraint->m_relpos2CrossNormal).m_floats = uVar10;
  *(long *)((solverConstraint->m_relpos2CrossNormal).m_floats + 2) = auVar21._0_8_;
  bVar30 = operator-(contactNormalOnB);
  *&(solverConstraint->m_contactNormal2).m_floats = bVar30.m_floats;
  if (this_00 == (btMultiBody *)0x0) {
    if (this_02 == (btRigidBody *)0x0) {
      fVar25 = 0.0;
    }
    else {
      bVar30 = btVector3::cross(&solverConstraint->m_angularComponentA,&local_78);
      uVar24 = 0;
      fVar25 = bVar30.m_floats[2] * contactNormalOnB->m_floats[2] +
               contactNormalOnB->m_floats[0] * bVar30.m_floats[0] +
               bVar30.m_floats[1] * contactNormalOnB->m_floats[1] + this_02->m_inverseMass;
    }
  }
  else {
    iVar11 = this_00->m_dofCount;
    if (this_00->m_dofCount < -5) {
      iVar11 = -6;
    }
    fVar25 = 0.0;
    for (uVar10 = 0; iVar11 + 6 != uVar10; uVar10 = uVar10 + 1) {
      fVar25 = fVar25 + (data->m_jacobians).m_data[(long)solverConstraint->m_jacAindex + uVar10] *
                        (data->m_deltaVelocitiesUnitImpulse).m_data
                        [(long)solverConstraint->m_jacAindex + uVar10];
    }
  }
  if (this_01 == (btMultiBody *)0x0) {
    if (local_c0 == (btRigidBody *)0x0) {
      auVar22 = ZEXT816(0);
    }
    else {
      torqueAxis0 = operator-(&solverConstraint->m_angularComponentB);
      bVar30 = btVector3::cross(&torqueAxis0,&local_88);
      auVar23._0_8_ = bVar30.m_floats._8_8_;
      auVar23._8_8_ = uVar24;
      auVar22._4_12_ = auVar23._4_12_;
      auVar22._0_4_ =
           bVar30.m_floats[2] * contactNormalOnB->m_floats[2] +
           contactNormalOnB->m_floats[0] * bVar30.m_floats[0] +
           bVar30.m_floats[1] * contactNormalOnB->m_floats[1] + local_c0->m_inverseMass;
    }
  }
  else {
    iVar11 = this_01->m_dofCount;
    if (iVar11 < -5) {
      iVar11 = -6;
    }
    auVar22 = ZEXT816(0);
    for (uVar10 = 0; iVar11 + 6 != uVar10; uVar10 = uVar10 + 1) {
      auVar22._0_4_ =
           auVar22._0_4_ +
           (data->m_jacobians).m_data[(long)solverConstraint->m_jacBindex + uVar10] *
           (data->m_deltaVelocitiesUnitImpulse).m_data[(long)solverConstraint->m_jacBindex + uVar10]
      ;
    }
  }
  fVar25 = fVar25 + auVar22._0_4_;
  solverConstraint->m_jacDiagABInv =
       (btScalar)(-(uint)(1.1920929e-07 < fVar25) & (uint)(local_58 / fVar25));
  fVar25 = (infoGlobal->super_btContactSolverInfoData).m_linearSlop;
  if (this_00 == (btMultiBody *)0x0) {
    if (this_02 == (btRigidBody *)0x0) {
      fVar29 = 0.0;
    }
    else {
      bVar30 = btRigidBody::getVelocityInLocalPoint(this_02,&local_78);
      fVar29 = bVar30.m_floats[2] * (solverConstraint->m_contactNormal1).m_floats[2] +
               (solverConstraint->m_contactNormal1).m_floats[0] * bVar30.m_floats[0] +
               bVar30.m_floats[1] * (solverConstraint->m_contactNormal1).m_floats[1] + 0.0;
    }
  }
  else {
    iVar11 = this_00->m_dofCount;
    if (iVar11 < -5) {
      iVar11 = -6;
    }
    fVar29 = 0.0;
    for (uVar10 = 0; iVar11 + 6 != uVar10; uVar10 = uVar10 + 1) {
      fVar29 = fVar29 + (this_00->m_realBuf).m_data[uVar10] *
                        (data->m_jacobians).m_data[(long)solverConstraint->m_jacAindex + uVar10];
    }
  }
  if (this_01 == (btMultiBody *)0x0) {
    if (local_c0 != (btRigidBody *)0x0) {
      bVar30 = btRigidBody::getVelocityInLocalPoint(local_c0,&local_88);
      fVar29 = fVar29 + bVar30.m_floats[2] * (solverConstraint->m_contactNormal2).m_floats[2] +
                        (solverConstraint->m_contactNormal2).m_floats[0] * bVar30.m_floats[0] +
                        bVar30.m_floats[1] * (solverConstraint->m_contactNormal2).m_floats[1];
    }
  }
  else {
    iVar11 = -6;
    if (-6 < this_01->m_dofCount) {
      iVar11 = this_01->m_dofCount;
    }
    for (uVar10 = 0; iVar11 + 6 != uVar10; uVar10 = uVar10 + 1) {
      fVar29 = fVar29 + (this_01->m_realBuf).m_data[uVar10] *
                        (data->m_jacobians).m_data[(long)solverConstraint->m_jacBindex + uVar10];
    }
  }
  fVar26 = 0.0;
  if (!isFriction) {
    fVar26 = fVar25 + posError;
  }
  solverConstraint->m_friction = 0.0;
  solverConstraint->m_appliedPushImpulse = 0.0;
  solverConstraint->m_appliedImpulse = 0.0;
  bVar17 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse == 0;
  pbVar1 = &(infoGlobal->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold;
  bVar27 = ((-fVar26 *
            (&(infoGlobal->super_btContactSolverInfoData).m_erp)
            [((NAN(fVar26) || NAN(*pbVar1)) || (*pbVar1 > fVar26 || fVar26 == *pbVar1)) && !bVar17])
           / (infoGlobal->super_btContactSolverInfoData).m_timeStep) *
           solverConstraint->m_jacDiagABInv;
  bVar28 = (desiredVelocity - fVar29) * solverConstraint->m_jacDiagABInv;
  if (*pbVar1 <= fVar26 && fVar26 != *pbVar1 || bVar17) {
    bVar28 = bVar28 + bVar27;
    bVar27 = 0.0;
  }
  solverConstraint->m_rhs = bVar28;
  solverConstraint->m_rhsPenetration = bVar27;
  solverConstraint->m_cfm = 0.0;
  solverConstraint->m_lowerLimit = lowerLimit;
  solverConstraint->m_upperLimit = upperLimit;
  return fVar29;
}

Assistant:

btScalar btMultiBodyConstraint::fillMultiBodyConstraint(	btMultiBodySolverConstraint& solverConstraint,
															btMultiBodyJacobianData& data,
															btScalar* jacOrgA, btScalar* jacOrgB,
															const btVector3& contactNormalOnB,
															const btVector3& posAworld, const btVector3& posBworld,
															btScalar posError,
															const btContactSolverInfo& infoGlobal,
															btScalar lowerLimit, btScalar upperLimit,
															btScalar relaxation,
															bool isFriction, btScalar desiredVelocity, btScalar cfmSlip)
{


	solverConstraint.m_multiBodyA = m_bodyA;
	solverConstraint.m_multiBodyB = m_bodyB;
	solverConstraint.m_linkA = m_linkA;
	solverConstraint.m_linkB = m_linkB;

	btMultiBody* multiBodyA = solverConstraint.m_multiBodyA;
	btMultiBody* multiBodyB = solverConstraint.m_multiBodyB;

	btSolverBody* bodyA = multiBodyA ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdA);
	btSolverBody* bodyB = multiBodyB ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdB);

	btRigidBody* rb0 = multiBodyA ? 0 : bodyA->m_originalBody;
	btRigidBody* rb1 = multiBodyB ? 0 : bodyB->m_originalBody;

	btVector3 rel_pos1, rel_pos2;				//these two used to be inited to posAworld and posBworld (respectively) but it does not seem necessary
	if (bodyA)
		rel_pos1 = posAworld - bodyA->getWorldTransform().getOrigin();
	if (bodyB)
		rel_pos2 = posBworld - bodyB->getWorldTransform().getOrigin();

	if (multiBodyA)
	{
		if (solverConstraint.m_linkA<0)
		{
			rel_pos1 = posAworld - multiBodyA->getBasePos();
		} else
		{
			rel_pos1 = posAworld - multiBodyA->getLink(solverConstraint.m_linkA).m_cachedWorldTransform.getOrigin();
		}

		const int ndofA  = multiBodyA->getNumDofs() + 6;

		solverConstraint.m_deltaVelAindex = multiBodyA->getCompanionId();

		if (solverConstraint.m_deltaVelAindex <0)
		{
			solverConstraint.m_deltaVelAindex = data.m_deltaVelocities.size();
			multiBodyA->setCompanionId(solverConstraint.m_deltaVelAindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofA);
		} else
		{
			btAssert(data.m_deltaVelocities.size() >= solverConstraint.m_deltaVelAindex+ndofA);
		}

		//determine jacobian of this 1D constraint in terms of multibodyA's degrees of freedom
		//resize..
		solverConstraint.m_jacAindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofA);
		//copy/determine
		if(jacOrgA)
		{
			for (int i=0;i<ndofA;i++)
				data.m_jacobians[solverConstraint.m_jacAindex+i] = jacOrgA[i];
		}
		else
		{
			btScalar* jac1=&data.m_jacobians[solverConstraint.m_jacAindex];
			multiBodyA->fillContactJacobianMultiDof(solverConstraint.m_linkA, posAworld, contactNormalOnB, jac1, data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine the velocity response of multibodyA to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofA);		//=> each constraint row has the constrained tree dofs allocated in m_deltaVelocitiesUnitImpulse
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
		//determine..
		multiBodyA->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacAindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}
	else //if(rb0)
	{
		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_angularComponentA = rb0 ? rb0->getInvInertiaTensorWorld()*torqueAxis0*rb0->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}

	if (multiBodyB)
	{
		if (solverConstraint.m_linkB<0)
		{
			rel_pos2 = posBworld - multiBodyB->getBasePos();
		} else
		{
			rel_pos2 = posBworld - multiBodyB->getLink(solverConstraint.m_linkB).m_cachedWorldTransform.getOrigin();
		}

		const int ndofB  = multiBodyB->getNumDofs() + 6;

		solverConstraint.m_deltaVelBindex = multiBodyB->getCompanionId();
		if (solverConstraint.m_deltaVelBindex <0)
		{
			solverConstraint.m_deltaVelBindex = data.m_deltaVelocities.size();
			multiBodyB->setCompanionId(solverConstraint.m_deltaVelBindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofB);
		}

		//determine jacobian of this 1D constraint in terms of multibodyB's degrees of freedom
		//resize..
		solverConstraint.m_jacBindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofB);
		//copy/determine..
		if(jacOrgB)
		{
			for (int i=0;i<ndofB;i++)
				data.m_jacobians[solverConstraint.m_jacBindex+i] = jacOrgB[i];
		}
		else
		{
			multiBodyB->fillContactJacobianMultiDof(solverConstraint.m_linkB, posBworld, -contactNormalOnB, &data.m_jacobians[solverConstraint.m_jacBindex], data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine velocity response of multibodyB to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofB);
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
		//determine..
		multiBodyB->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacBindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;

	}
	else //if(rb1)
	{
		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_angularComponentB = rb1 ? rb1->getInvInertiaTensorWorld()*-torqueAxis1*rb1->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;
	}
	{

		btVector3 vec;
		btScalar denom0 = 0.f;
		btScalar denom1 = 0.f;
		btScalar* jacB = 0;
		btScalar* jacA = 0;
		btScalar* deltaVelA = 0;
		btScalar* deltaVelB = 0;
		int ndofA  = 0;
		//determine the "effective mass" of the constrained multibodyA with respect to this 1D constraint (i.e. 1/A[i,i])
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			deltaVelA = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA; ++i)
			{
				btScalar j = jacA[i] ;
				btScalar l = deltaVelA[i];
				denom0 += j*l;
			}
		}
		else if(rb0)
		{
			vec = ( solverConstraint.m_angularComponentA).cross(rel_pos1);
			denom0 = rb0->getInvMass() + contactNormalOnB.dot(vec);
		}
		//
		if (multiBodyB)
		{
			const int ndofB = multiBodyB->getNumDofs() + 6;
			jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			deltaVelB = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB; ++i)
			{
				btScalar j = jacB[i] ;
				btScalar l = deltaVelB[i];
				denom1 += j*l;
			}

		}
		else if(rb1)
		{
			vec = ( -solverConstraint.m_angularComponentB).cross(rel_pos2);
			denom1 = rb1->getInvMass() + contactNormalOnB.dot(vec);
		}

		//
		btScalar d = denom0+denom1;
		if (d>SIMD_EPSILON)
		{
			solverConstraint.m_jacDiagABInv = relaxation/(d);
		}
		else
		{
		//disable the constraint row to handle singularity/redundant constraint
			solverConstraint.m_jacDiagABInv  = 0.f;
		}
	}


	//compute rhs and remaining solverConstraint fields
	btScalar penetration = isFriction? 0 : posError+infoGlobal.m_linearSlop;

	btScalar rel_vel = 0.f;
	int ndofA  = 0;
	int ndofB  = 0;
	{
		btVector3 vel1,vel2;
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			btScalar* jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA ; ++i)
				rel_vel += multiBodyA->getVelocityVector()[i] * jacA[i];
		}
		else if(rb0)
		{
			rel_vel += rb0->getVelocityInLocalPoint(rel_pos1).dot(solverConstraint.m_contactNormal1);
		}
		if (multiBodyB)
		{
			ndofB = multiBodyB->getNumDofs() + 6;
			btScalar* jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB ; ++i)
				rel_vel += multiBodyB->getVelocityVector()[i] * jacB[i];

		}
		else if(rb1)
		{
			rel_vel += rb1->getVelocityInLocalPoint(rel_pos2).dot(solverConstraint.m_contactNormal2);
		}

		solverConstraint.m_friction = 0.f;//cp.m_combinedFriction;
	}


	///warm starting (or zero if disabled)
	/*
	if (infoGlobal.m_solverMode & SOLVER_USE_WARMSTARTING)
	{
		solverConstraint.m_appliedImpulse = isFriction ? 0 : cp.m_appliedImpulse * infoGlobal.m_warmstartingFactor;

		if (solverConstraint.m_appliedImpulse)
		{
			if (multiBodyA)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
				multiBodyA->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelAindex,ndofA);
			} else
			{
				if (rb0)
					bodyA->internalApplyImpulse(solverConstraint.m_contactNormal1*bodyA->internalGetInvMass()*rb0->getLinearFactor(),solverConstraint.m_angularComponentA,solverConstraint.m_appliedImpulse);
			}
			if (multiBodyB)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
				multiBodyB->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelBindex,ndofB);
			} else
			{
				if (rb1)
					bodyB->internalApplyImpulse(-solverConstraint.m_contactNormal2*bodyB->internalGetInvMass()*rb1->getLinearFactor(),-solverConstraint.m_angularComponentB,-(btScalar)solverConstraint.m_appliedImpulse);
			}
		}
	} else
	*/

	solverConstraint.m_appliedImpulse = 0.f;
	solverConstraint.m_appliedPushImpulse = 0.f;

	{

		btScalar positionalError = 0.f;
		btScalar	velocityError = desiredVelocity - rel_vel;// * damping;


		btScalar erp = infoGlobal.m_erp2;
		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			erp = infoGlobal.m_erp;
		}

		positionalError = -penetration * erp/infoGlobal.m_timeStep;

		btScalar  penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
		btScalar velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;

		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			//combine position and velocity into rhs
			solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
			solverConstraint.m_rhsPenetration = 0.f;

		} else
		{
			//split position and velocity into rhs and m_rhsPenetration
			solverConstraint.m_rhs = velocityImpulse;
			solverConstraint.m_rhsPenetration = penetrationImpulse;
		}

		solverConstraint.m_cfm = 0.f;
		solverConstraint.m_lowerLimit = lowerLimit;
		solverConstraint.m_upperLimit = upperLimit;
	}

	return rel_vel;

}